

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void AdditionHelper<unsigned_char,long_long,9>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *lhs,longlong *rhs,uchar *result)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = *rhs;
  bVar1 = *lhs;
  if (lVar2 < 0) {
    if ((ulong)-lVar2 <= (ulong)bVar1) {
      uVar3 = (ulong)(byte)((char)lVar2 + bVar1);
      goto LAB_001112e9;
    }
  }
  else {
    uVar3 = lVar2 + (ulong)bVar1;
    if (uVar3 < 0x100) {
LAB_001112e9:
      *result = (uchar)uVar3;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is unsigned and < 64-bit, rhs std::int64_t
        if( rhs < 0 )
        {
            if( lhs >= ~(std::uint64_t)( rhs ) + 1) //negation is safe, since rhs is 64-bit
            {
                result = (T)( lhs + rhs );
                return;
            }
        }
        else
        {
            // now we know that rhs can be safely cast into an std::uint64_t
            std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

            // special case - rhs cannot be larger than 0x7fffffffffffffff, lhs cannot be larger than 0xffffffff
            // it is not possible for the operation above to overflow, so just check max
            if( tmp <= std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        E::SafeIntOnOverflow();
    }